

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gencode.c
# Opt level: O2

block * gen_protochain(compiler_state_t *cstate,int v,int proto,int dir)

{
  int iVar1;
  block *b0;
  block *b1;
  slist *psVar2;
  slist *psVar3;
  long lVar4;
  ulong uVar5;
  bpf_int32 bVar6;
  uint uVar7;
  slist **ppsVar8;
  char *fmt;
  ulong uVar9;
  block *local_360;
  slist *s [100];
  
  iVar1 = alloc_reg(cstate);
  ppsVar8 = s;
  memset(ppsVar8,0,800);
  if ((proto == 0x11) || (proto == 2)) {
    if ((cstate->off_linkpl).is_variable != 0) {
      fmt = "\'protochain\' not supported with variable length headers";
      goto LAB_0010d8e8;
    }
    cstate->no_optimize = 1;
    s[0] = new_stmt(cstate,0);
    if (proto == 0x11) {
      local_360 = gen_linktype(cstate,0x86dd);
      s[1] = new_stmt(cstate,0x30);
      (s[1]->s).k = (cstate->off_linkpl).constant_part + cstate->off_nl + 6;
      s[2] = new_stmt(cstate,1);
      bVar6 = 0x28;
    }
    else {
      if (proto != 2) {
        fmt = "unsupported proto to gen_protochain";
        goto LAB_0010d8e8;
      }
      local_360 = gen_linktype(cstate,0x800);
      s[1] = new_stmt(cstate,0x30);
      (s[1]->s).k = (cstate->off_linkpl).constant_part + cstate->off_nl + 9;
      s[2] = new_stmt(cstate,0xb1);
      bVar6 = cstate->off_nl + (cstate->off_linkpl).constant_part;
    }
    (s[2]->s).k = bVar6;
    s[3] = new_stmt(cstate,0x15);
    (s[3]->s).k = v;
    (s[3]->s).jt = (slist *)0x0;
    (s[3]->s).jf = (slist *)0x0;
    psVar2 = new_stmt(cstate,0x15);
    (psVar2->s).jt = (slist *)0x0;
    (psVar2->s).jf = (slist *)0x0;
    (psVar2->s).k = 0x3b;
    (s[3]->s).jf = psVar2;
    s[4] = psVar2;
    if (proto == 0x11) {
      ppsVar8 = s + 8;
      psVar2 = new_stmt(cstate,0x15);
      (psVar2->s).jt = (slist *)0x0;
      (psVar2->s).jf = (slist *)0x0;
      (psVar2->s).k = 0;
      (s[4]->s).jf = psVar2;
      s[5] = psVar2;
      psVar3 = new_stmt(cstate,0x15);
      (psVar2->s).jf = psVar3;
      (psVar3->s).jt = (slist *)0x0;
      (psVar3->s).jf = (slist *)0x0;
      (psVar3->s).k = 0x3c;
      s[6] = psVar3;
      psVar2 = new_stmt(cstate,0x15);
      (psVar3->s).jf = psVar2;
      (psVar2->s).jt = (slist *)0x0;
      (psVar2->s).jf = (slist *)0x0;
      (psVar2->s).k = 0x2b;
      s[7] = psVar2;
      s[8] = new_stmt(cstate,0x15);
      (psVar2->s).jf = s[8];
      (s[8]->s).jt = (slist *)0x0;
      (s[8]->s).jf = (slist *)0x0;
      (s[8]->s).k = 0x2c;
      s[9] = new_stmt(cstate,0x50);
      (s[9]->s).k = cstate->off_nl + (cstate->off_linkpl).constant_part;
      s[10] = new_stmt(cstate,2);
      (s[10]->s).k = iVar1;
      s[0xb] = new_stmt(cstate,0x50);
      (s[0xb]->s).k = (cstate->off_linkpl).constant_part + cstate->off_nl + 1;
      s[0xc] = new_stmt(cstate,4);
      (s[0xc]->s).k = 1;
      s[0xd] = new_stmt(cstate,0x24);
      (s[0xd]->s).k = 8;
      s[0xe] = new_stmt(cstate,0xc);
      (s[0xe]->s).k = 0;
      s[0xf] = new_stmt(cstate,7);
      psVar2 = new_stmt(cstate,0x60);
      (psVar2->s).k = iVar1;
      s[0x10] = psVar2;
      s[0x11] = new_stmt(cstate,5);
      (s[0x11]->s).k = -0xf;
      (psVar2->s).jf = s[0x11];
      uVar7 = 0x12;
      for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
        (s[lVar4 + 5]->s).jt = s[9];
      }
    }
    else {
      s[5] = new_stmt(cstate,4);
      (s[5]->s).k = 0;
      (psVar2->s).jf = s[5];
      uVar7 = 6;
    }
    psVar2 = new_stmt(cstate,0x15);
    s[uVar7] = psVar2;
    (psVar2->s).jt = (slist *)0x0;
    (s[uVar7]->s).jf = (slist *)0x0;
    psVar2 = s[uVar7];
    (psVar2->s).k = 0x33;
    if (proto == 0x11) {
      ((*ppsVar8)->s).jf = psVar2;
    }
    ppsVar8 = s + 3;
    psVar2 = new_stmt(cstate,0x87);
    s[(ulong)uVar7 + 1] = psVar2;
    uVar5 = (ulong)(uVar7 * 8);
    *(slist **)(*(long *)((long)s + uVar5) + 8) = psVar2;
    psVar2 = new_stmt(cstate,0x50);
    *(slist **)((long)s + uVar5 + 0x10) = psVar2;
    (psVar2->s).k = cstate->off_nl + (cstate->off_linkpl).constant_part;
    psVar2 = new_stmt(cstate,2);
    *(slist **)((long)s + uVar5 + 0x18) = psVar2;
    (psVar2->s).k = iVar1;
    psVar3 = new_stmt(cstate,0x87);
    *(slist **)((long)s + uVar5 + 0x20) = psVar3;
    (psVar2->s).jt = psVar3;
    psVar2 = new_stmt(cstate,4);
    *(slist **)((long)s + uVar5 + 0x28) = psVar2;
    (psVar2->s).k = 1;
    psVar2 = new_stmt(cstate,7);
    *(slist **)((long)s + uVar5 + 0x30) = psVar2;
    psVar2 = new_stmt(cstate,0x50);
    *(slist **)((long)s + uVar5 + 0x38) = psVar2;
    (psVar2->s).k = cstate->off_nl + (cstate->off_linkpl).constant_part;
    psVar2 = new_stmt(cstate,4);
    s[(ulong)uVar7 + 8] = psVar2;
    (psVar2->s).k = 2;
    psVar2 = new_stmt(cstate,0x24);
    s[(ulong)uVar7 + 9] = psVar2;
    (psVar2->s).k = 4;
    psVar2 = new_stmt(cstate,7);
    *(slist **)((long)s + uVar5 + 0x50) = psVar2;
    psVar2 = new_stmt(cstate,0x60);
    *(slist **)((long)s + uVar5 + 0x58) = psVar2;
    (psVar2->s).k = iVar1;
    psVar2 = new_stmt(cstate,5);
    *(slist **)((long)s + uVar5 + 0x60) = psVar2;
    (psVar2->s).k = -10 - uVar7;
    uVar9 = (ulong)(uVar7 + 0xd);
    psVar2 = new_stmt(cstate,4);
    s[uVar9] = psVar2;
    (psVar2->s).k = 0;
    (s[4]->s).jt = psVar2;
    psVar2 = s[uVar9];
    *(slist **)(*(long *)((long)s + uVar5) + 0x10) = psVar2;
    lVar4 = 8;
    for (uVar5 = 0; *(slist **)((long)&((*ppsVar8)->s).code + lVar4) = psVar2, uVar9 != uVar5;
        uVar5 = uVar5 + 1) {
      ppsVar8 = s + uVar5;
      psVar2 = s[uVar5 + 1];
      lVar4 = 0x20;
    }
    s[uVar9]->next = (slist *)0x0;
    b1 = new_block(cstate,0x15);
    b1->stmts = s[1];
    (b1->s).k = v;
    cstate->regused[iVar1] = 0;
    gen_and(local_360,b1);
  }
  else {
    if (proto != 0) {
      fmt = "bad protocol applied for \'protochain\'";
LAB_0010d8e8:
      bpf_error(cstate,fmt);
    }
    b0 = gen_protochain(cstate,v,2,dir);
    b1 = gen_protochain(cstate,v,0x11,dir);
    gen_or(b0,b1);
  }
  return b1;
}

Assistant:

static struct block *
gen_protochain(compiler_state_t *cstate, int v, int proto, int dir)
{
#ifdef NO_PROTOCHAIN
	return gen_proto(cstate, v, proto, dir);
#else
	struct block *b0, *b;
	struct slist *s[100];
	int fix2, fix3, fix4, fix5;
	int ahcheck, again, end;
	int i, max;
	int reg2 = alloc_reg(cstate);

	memset(s, 0, sizeof(s));
	fix3 = fix4 = fix5 = 0;

	switch (proto) {
	case Q_IP:
	case Q_IPV6:
		break;
	case Q_DEFAULT:
		b0 = gen_protochain(cstate, v, Q_IP, dir);
		b = gen_protochain(cstate, v, Q_IPV6, dir);
		gen_or(b0, b);
		return b;
	default:
		bpf_error(cstate, "bad protocol applied for 'protochain'");
		/*NOTREACHED*/
	}

	/*
	 * We don't handle variable-length prefixes before the link-layer
	 * header, or variable-length link-layer headers, here yet.
	 * We might want to add BPF instructions to do the protochain
	 * work, to simplify that and, on platforms that have a BPF
	 * interpreter with the new instructions, let the filtering
	 * be done in the kernel.  (We already require a modified BPF
	 * engine to do the protochain stuff, to support backward
	 * branches, and backward branch support is unlikely to appear
	 * in kernel BPF engines.)
	 */
	if (cstate->off_linkpl.is_variable)
		bpf_error(cstate, "'protochain' not supported with variable length headers");

	cstate->no_optimize = 1; /*this code is not compatible with optimzer yet */

	/*
	 * s[0] is a dummy entry to protect other BPF insn from damage
	 * by s[fix] = foo with uninitialized variable "fix".  It is somewhat
	 * hard to find interdependency made by jump table fixup.
	 */
	i = 0;
	s[i] = new_stmt(cstate, 0);	/*dummy*/
	i++;

	switch (proto) {
	case Q_IP:
		b0 = gen_linktype(cstate, ETHERTYPE_IP);

		/* A = ip->ip_p */
		s[i] = new_stmt(cstate, BPF_LD|BPF_ABS|BPF_B);
		s[i]->s.k = cstate->off_linkpl.constant_part + cstate->off_nl + 9;
		i++;
		/* X = ip->ip_hl << 2 */
		s[i] = new_stmt(cstate, BPF_LDX|BPF_MSH|BPF_B);
		s[i]->s.k = cstate->off_linkpl.constant_part + cstate->off_nl;
		i++;
		break;

	case Q_IPV6:
		b0 = gen_linktype(cstate, ETHERTYPE_IPV6);

		/* A = ip6->ip_nxt */
		s[i] = new_stmt(cstate, BPF_LD|BPF_ABS|BPF_B);
		s[i]->s.k = cstate->off_linkpl.constant_part + cstate->off_nl + 6;
		i++;
		/* X = sizeof(struct ip6_hdr) */
		s[i] = new_stmt(cstate, BPF_LDX|BPF_IMM);
		s[i]->s.k = 40;
		i++;
		break;

	default:
		bpf_error(cstate, "unsupported proto to gen_protochain");
		/*NOTREACHED*/
	}

	/* again: if (A == v) goto end; else fall through; */
	again = i;
	s[i] = new_stmt(cstate, BPF_JMP|BPF_JEQ|BPF_K);
	s[i]->s.k = v;
	s[i]->s.jt = NULL;		/*later*/
	s[i]->s.jf = NULL;		/*update in next stmt*/
	fix5 = i;
	i++;

#ifndef IPPROTO_NONE
#define IPPROTO_NONE	59
#endif
	/* if (A == IPPROTO_NONE) goto end */
	s[i] = new_stmt(cstate, BPF_JMP|BPF_JEQ|BPF_K);
	s[i]->s.jt = NULL;	/*later*/
	s[i]->s.jf = NULL;	/*update in next stmt*/
	s[i]->s.k = IPPROTO_NONE;
	s[fix5]->s.jf = s[i];
	fix2 = i;
	i++;

	if (proto == Q_IPV6) {
		int v6start, v6end, v6advance, j;

		v6start = i;
		/* if (A == IPPROTO_HOPOPTS) goto v6advance */
		s[i] = new_stmt(cstate, BPF_JMP|BPF_JEQ|BPF_K);
		s[i]->s.jt = NULL;	/*later*/
		s[i]->s.jf = NULL;	/*update in next stmt*/
		s[i]->s.k = IPPROTO_HOPOPTS;
		s[fix2]->s.jf = s[i];
		i++;
		/* if (A == IPPROTO_DSTOPTS) goto v6advance */
		s[i - 1]->s.jf = s[i] = new_stmt(cstate, BPF_JMP|BPF_JEQ|BPF_K);
		s[i]->s.jt = NULL;	/*later*/
		s[i]->s.jf = NULL;	/*update in next stmt*/
		s[i]->s.k = IPPROTO_DSTOPTS;
		i++;
		/* if (A == IPPROTO_ROUTING) goto v6advance */
		s[i - 1]->s.jf = s[i] = new_stmt(cstate, BPF_JMP|BPF_JEQ|BPF_K);
		s[i]->s.jt = NULL;	/*later*/
		s[i]->s.jf = NULL;	/*update in next stmt*/
		s[i]->s.k = IPPROTO_ROUTING;
		i++;
		/* if (A == IPPROTO_FRAGMENT) goto v6advance; else goto ahcheck; */
		s[i - 1]->s.jf = s[i] = new_stmt(cstate, BPF_JMP|BPF_JEQ|BPF_K);
		s[i]->s.jt = NULL;	/*later*/
		s[i]->s.jf = NULL;	/*later*/
		s[i]->s.k = IPPROTO_FRAGMENT;
		fix3 = i;
		v6end = i;
		i++;

		/* v6advance: */
		v6advance = i;

		/*
		 * in short,
		 * A = P[X + packet head];
		 * X = X + (P[X + packet head + 1] + 1) * 8;
		 */
		/* A = P[X + packet head] */
		s[i] = new_stmt(cstate, BPF_LD|BPF_IND|BPF_B);
		s[i]->s.k = cstate->off_linkpl.constant_part + cstate->off_nl;
		i++;
		/* MEM[reg2] = A */
		s[i] = new_stmt(cstate, BPF_ST);
		s[i]->s.k = reg2;
		i++;
		/* A = P[X + packet head + 1]; */
		s[i] = new_stmt(cstate, BPF_LD|BPF_IND|BPF_B);
		s[i]->s.k = cstate->off_linkpl.constant_part + cstate->off_nl + 1;
		i++;
		/* A += 1 */
		s[i] = new_stmt(cstate, BPF_ALU|BPF_ADD|BPF_K);
		s[i]->s.k = 1;
		i++;
		/* A *= 8 */
		s[i] = new_stmt(cstate, BPF_ALU|BPF_MUL|BPF_K);
		s[i]->s.k = 8;
		i++;
		/* A += X */
		s[i] = new_stmt(cstate, BPF_ALU|BPF_ADD|BPF_X);
		s[i]->s.k = 0;
		i++;
		/* X = A; */
		s[i] = new_stmt(cstate, BPF_MISC|BPF_TAX);
		i++;
		/* A = MEM[reg2] */
		s[i] = new_stmt(cstate, BPF_LD|BPF_MEM);
		s[i]->s.k = reg2;
		i++;

		/* goto again; (must use BPF_JA for backward jump) */
		s[i] = new_stmt(cstate, BPF_JMP|BPF_JA);
		s[i]->s.k = again - i - 1;
		s[i - 1]->s.jf = s[i];
		i++;

		/* fixup */
		for (j = v6start; j <= v6end; j++)
			s[j]->s.jt = s[v6advance];
	} else {
		/* nop */
		s[i] = new_stmt(cstate, BPF_ALU|BPF_ADD|BPF_K);
		s[i]->s.k = 0;
		s[fix2]->s.jf = s[i];
		i++;
	}

	/* ahcheck: */
	ahcheck = i;
	/* if (A == IPPROTO_AH) then fall through; else goto end; */
	s[i] = new_stmt(cstate, BPF_JMP|BPF_JEQ|BPF_K);
	s[i]->s.jt = NULL;	/*later*/
	s[i]->s.jf = NULL;	/*later*/
	s[i]->s.k = IPPROTO_AH;
	if (fix3)
		s[fix3]->s.jf = s[ahcheck];
	fix4 = i;
	i++;

	/*
	 * in short,
	 * A = P[X];
	 * X = X + (P[X + 1] + 2) * 4;
	 */
	/* A = X */
	s[i - 1]->s.jt = s[i] = new_stmt(cstate, BPF_MISC|BPF_TXA);
	i++;
	/* A = P[X + packet head]; */
	s[i] = new_stmt(cstate, BPF_LD|BPF_IND|BPF_B);
	s[i]->s.k = cstate->off_linkpl.constant_part + cstate->off_nl;
	i++;
	/* MEM[reg2] = A */
	s[i] = new_stmt(cstate, BPF_ST);
	s[i]->s.k = reg2;
	i++;
	/* A = X */
	s[i - 1]->s.jt = s[i] = new_stmt(cstate, BPF_MISC|BPF_TXA);
	i++;
	/* A += 1 */
	s[i] = new_stmt(cstate, BPF_ALU|BPF_ADD|BPF_K);
	s[i]->s.k = 1;
	i++;
	/* X = A */
	s[i] = new_stmt(cstate, BPF_MISC|BPF_TAX);
	i++;
	/* A = P[X + packet head] */
	s[i] = new_stmt(cstate, BPF_LD|BPF_IND|BPF_B);
	s[i]->s.k = cstate->off_linkpl.constant_part + cstate->off_nl;
	i++;
	/* A += 2 */
	s[i] = new_stmt(cstate, BPF_ALU|BPF_ADD|BPF_K);
	s[i]->s.k = 2;
	i++;
	/* A *= 4 */
	s[i] = new_stmt(cstate, BPF_ALU|BPF_MUL|BPF_K);
	s[i]->s.k = 4;
	i++;
	/* X = A; */
	s[i] = new_stmt(cstate, BPF_MISC|BPF_TAX);
	i++;
	/* A = MEM[reg2] */
	s[i] = new_stmt(cstate, BPF_LD|BPF_MEM);
	s[i]->s.k = reg2;
	i++;

	/* goto again; (must use BPF_JA for backward jump) */
	s[i] = new_stmt(cstate, BPF_JMP|BPF_JA);
	s[i]->s.k = again - i - 1;
	i++;

	/* end: nop */
	end = i;
	s[i] = new_stmt(cstate, BPF_ALU|BPF_ADD|BPF_K);
	s[i]->s.k = 0;
	s[fix2]->s.jt = s[end];
	s[fix4]->s.jf = s[end];
	s[fix5]->s.jt = s[end];
	i++;

	/*
	 * make slist chain
	 */
	max = i;
	for (i = 0; i < max - 1; i++)
		s[i]->next = s[i + 1];
	s[max - 1]->next = NULL;

	/*
	 * emit final check
	 */
	b = new_block(cstate, JMP(BPF_JEQ));
	b->stmts = s[1];	/*remember, s[0] is dummy*/
	b->s.k = v;

	free_reg(cstate, reg2);

	gen_and(b0, b);
	return b;
#endif
}